

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

int chrono::collision::GetIndex
              (ChVector<double> *vertex,
              vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              *vertexOUT,double tol)

{
  pointer pCVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pCVar1 = (vertexOUT->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(vertexOUT->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar2 != 0) {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    uVar4 = (lVar2 >> 3) * -0x5555555555555555;
    uVar3 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pCVar1[uVar3].m_data[0] - vertex->m_data[0];
      auVar6 = vandpd_avx(auVar6,auVar5);
      if (auVar6._0_8_ < tol) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pCVar1[uVar3].m_data[1] - vertex->m_data[1];
        auVar6 = vandpd_avx(auVar7,auVar5);
        if ((auVar6._0_8_ < tol) &&
           (auVar8._8_8_ = 0, auVar8._0_8_ = pCVar1[uVar3].m_data[2] - vertex->m_data[2],
           auVar6 = vandpd_avx(auVar8,auVar5), auVar6._0_8_ < tol)) goto LAB_007f5694;
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 <= uVar4 && uVar4 - uVar3 != 0);
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            (vertexOUT,vertex);
  uVar3 = (ulong)((int)((ulong)((long)(vertexOUT->
                                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vertexOUT->
                                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                 - 1);
LAB_007f5694:
  return (int)uVar3;
}

Assistant:

int GetIndex(ChVector<double> vertex, std::vector<ChVector<double> >& vertexOUT, double tol) {
    // Suboptimal: search vertexes with same position and reuse, (in future: adopt hash map..)
    for (unsigned int iv = 0; iv < vertexOUT.size(); iv++) {
        if (vertex.Equals(vertexOUT[iv], tol)) {
            return iv;
        }
    }
    // not found, so add it to new vertexes
    vertexOUT.push_back(vertex);
    return ((int)vertexOUT.size() - 1);
}